

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlc.h
# Opt level: O0

int Wlc_ObjIsSignedFanin1(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  Wlc_Obj_t *pWVar1;
  uint local_1c;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  if (p->fSmtLib == 0) {
    pWVar1 = Wlc_ObjFanin1(p,pObj);
    local_1c = (uint)(*(ushort *)pWVar1 >> 6 & 1);
  }
  else {
    local_1c = Wlc_ObjIsSigned(pObj);
  }
  return local_1c;
}

Assistant:

static inline int          Wlc_ObjIsSignedFanin1( Wlc_Ntk_t * p, Wlc_Obj_t * pObj ) { return p->fSmtLib ? Wlc_ObjIsSigned(pObj) : Wlc_ObjFanin1(p, pObj)->Signed; }